

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternMatcher.cpp
# Opt level: O0

void __thiscall
AssemblyCode::PatternMatcher::GenerateCodeForNode
          (PatternMatcher *this,INode *node,CTemp *dest,AssemblyCommands *commands)

{
  pointer *pppVar1;
  bool bVar2;
  uint uVar3;
  reference psVar4;
  element_type *peVar5;
  reference ppVar6;
  reference psVar7;
  undefined1 local_100 [8];
  shared_ptr<AssemblyCode::AssemblyCommand> command;
  iterator __end1_2;
  iterator __begin1_2;
  AssemblyCommands *__range1_2;
  pair<IRT::CTemp,_const_IRT::INode_*> child;
  iterator __end1_1;
  iterator __begin1_1;
  ChildrenTemps *__range1_1;
  undefined1 local_88 [8];
  shared_ptr<IRT::TreePattern> pattern;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
  *__range1;
  int i;
  bool result;
  ChildrenTemps children;
  AssemblyCommands nodeCommands;
  AssemblyCommands *commands_local;
  CTemp *dest_local;
  INode *node_local;
  PatternMatcher *this_local;
  
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::vector((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
            *)&children.
               super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
  ::vector((vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
            *)&i);
  __range1._7_1_ = 0;
  __end1 = std::
           vector<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
           ::begin(&this->patterns);
  pattern.super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
       ::end(&this->patterns);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<IRT::TreePattern>_*,_std::vector<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>_>
                                     *)&pattern.
                                        super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar2) {
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<IRT::TreePattern>_*,_std::vector<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<IRT::TreePattern>::shared_ptr((shared_ptr<IRT::TreePattern> *)local_88,psVar4);
    std::
    vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
    ::clear((vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
             *)&i);
    pppVar1 = &children.
               super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
    ::clear((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
             *)pppVar1);
    peVar5 = std::__shared_ptr_access<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    uVar3 = (*peVar5->_vptr_TreePattern[4])
                      (peVar5,node,dest,
                       (vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                        *)&i,pppVar1);
    __range1._7_1_ = (byte)uVar3 & 1;
    std::shared_ptr<IRT::TreePattern>::~shared_ptr((shared_ptr<IRT::TreePattern> *)local_88);
    if ((uVar3 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<IRT::TreePattern>_*,_std::vector<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>_>
    ::operator++(&__end1);
  }
  if (__range1._7_1_ != 0) {
    __end1_1 = std::
               vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
               ::begin((vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                        *)&i);
    child.second = (INode *)std::
                            vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                            ::end((vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                                   *)&i);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<std::pair<IRT::CTemp,_const_IRT::INode_*>_*,_std::vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>_>
                               *)&child.second), bVar2) {
      ppVar6 = __gnu_cxx::
               __normal_iterator<std::pair<IRT::CTemp,_const_IRT::INode_*>_*,_std::vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>_>
               ::operator*(&__end1_1);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::pair
                ((pair<IRT::CTemp,_const_IRT::INode_*> *)&__range1_2,ppVar6);
      GenerateCodeForNode(this,(INode *)child.first._24_8_,(CTemp *)&__range1_2,commands);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair
                ((pair<IRT::CTemp,_const_IRT::INode_*> *)&__range1_2);
      __gnu_cxx::
      __normal_iterator<std::pair<IRT::CTemp,_const_IRT::INode_*>_*,_std::vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>_>
      ::operator++(&__end1_1);
    }
    pppVar1 = &children.
               super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1_2 = std::
               vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
               ::begin((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                        *)pppVar1);
    command.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
         ::end((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                *)pppVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
                               *)&command.
                                  super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount), bVar2) {
      psVar7 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
               ::operator*(&__end1_2);
      std::shared_ptr<AssemblyCode::AssemblyCommand>::shared_ptr
                ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_100,psVar7);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      ::push_back(commands,(shared_ptr<AssemblyCode::AssemblyCommand> *)local_100);
      std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_100);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
      ::operator++(&__end1_2);
    }
    std::
    vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
    ::~vector((vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
               *)&i);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
    ::~vector((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
               *)&children.
                  super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  __assert_fail("result",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/utils/PatternMatcher.cpp"
                ,0x18,
                "void AssemblyCode::PatternMatcher::GenerateCodeForNode(const IRT::INode *, const IRT::CTemp &, AssemblyCommands &)"
               );
}

Assistant:

void AssemblyCode::PatternMatcher::GenerateCodeForNode( const IRT::INode *node, const IRT::CTemp &dest,
                                                        AssemblyCommands &commands ) {

    AssemblyCommands nodeCommands;
    ChildrenTemps children;
    bool result = false;
    int i = 0;
    for ( auto pattern : patterns ) {
        children.clear( );
        nodeCommands.clear( );
        result = pattern->TryToGenerateCode( node, dest, children, nodeCommands );
        if ( result ) {
            break;
        }
        ++i;
    }
    assert( result );
    for ( auto child : children ) {
        GenerateCodeForNode( child.second, child.first, commands );
    }
    for ( auto command: nodeCommands ) {
        commands.push_back( command );
    }
}